

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Extractor.cpp
# Opt level: O2

void __thiscall Extractor::~Extractor(Extractor *this)

{
  void *in_RSI;
  
  _free(this,in_RSI);
  std::__cxx11::string::~string((string *)&this->_file_name);
  std::_Vector_base<WaveFile_*,_std::allocator<WaveFile_*>_>::~_Vector_base
            ((_Vector_base<WaveFile_*,_std::allocator<WaveFile_*>_> *)this);
  return;
}

Assistant:

Extractor::~Extractor()
{
	_free();
}